

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O1

void strpool_defrag(strpool_t *pool)

{
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  strpool_internal_hash_slot_t *__s;
  char *pcVar9;
  strpool_internal_entry_t *psVar10;
  strpool_internal_entry_t *psVar11;
  strpool_internal_block_t *psVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  char *__dest;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  strpool_internal_entry_t *psVar22;
  
  if ((long)pool->entry_count < 1) {
    uVar20 = 0;
    iVar7 = 0;
  }
  else {
    lVar15 = 0;
    iVar7 = 0;
    uVar20 = 0;
    do {
      if (0 < *(int *)((long)&pool->entries->refcount + lVar15)) {
        iVar7 = iVar7 + *(int *)((long)&pool->entries->size + lVar15);
        uVar20 = (ulong)((int)uVar20 + 1);
      }
      lVar15 = lVar15 + 0x20;
    } while ((long)pool->entry_count * 0x20 != lVar15);
  }
  iVar21 = pool->block_size;
  if (iVar21 <= iVar7) {
    uVar13 = iVar7 - 1U >> 1 | iVar7 - 1U;
    uVar13 = uVar13 >> 2 | uVar13;
    uVar13 = uVar13 >> 4 | uVar13;
    uVar13 = uVar13 >> 8 | uVar13;
    uVar13 = uVar13 >> 0x10 | uVar13;
    iVar21 = uVar13 + 1 + (uint)(uVar13 == 0xffffffff);
  }
  iVar18 = (int)uVar20;
  iVar8 = ((int)(uVar20 >> 0x1f) + iVar18 >> 1) + iVar18;
  iVar7 = pool->initial_entry_capacity * 2;
  if (iVar7 <= iVar8) {
    uVar13 = iVar8 - 1;
    uVar13 = uVar13 >> 1 | uVar13;
    uVar13 = uVar13 >> 2 | uVar13;
    uVar13 = uVar13 >> 4 | uVar13;
    uVar13 = uVar13 >> 8 | uVar13;
    uVar13 = uVar13 >> 0x10 | uVar13;
    iVar7 = uVar13 + 1 + (uint)(uVar13 == 0xffffffff);
  }
  __s = (strpool_internal_hash_slot_t *)
        (**pool->memctx)(0,(long)iVar7 * 0xc,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  if (__s == (strpool_internal_hash_slot_t *)0x0) {
    __assert_fail("hash_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x29e,"void strpool_defrag(strpool_t *)");
  }
  memset(__s,0,(long)iVar7 * 0xc);
  pcVar9 = (char *)(**pool->memctx)(0,(long)iVar21,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  if (pcVar9 == (char *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x2a2,"void strpool_defrag(strpool_t *)");
  }
  iVar8 = pool->initial_entry_capacity;
  if (iVar8 <= iVar18) {
    uVar13 = iVar18 - 1U >> 1 | iVar18 - 1U;
    uVar13 = uVar13 >> 2 | uVar13;
    uVar13 = uVar13 >> 4 | uVar13;
    uVar13 = uVar13 >> 8 | uVar13;
    uVar13 = uVar13 >> 0x10 | uVar13;
    iVar8 = uVar13 + 1 + (uint)(uVar13 == 0xffffffff);
  }
  psVar10 = (strpool_internal_entry_t *)
            (**pool->memctx)(0,(long)iVar8 << 5,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  if (psVar10 != (strpool_internal_entry_t *)0x0) {
    __dest = pcVar9;
    if (0 < pool->entry_count) {
      lVar15 = 0;
      iVar19 = 0;
      do {
        if (0 < pool->entries[lVar15].refcount) {
          psVar22 = pool->entries + lVar15;
          iVar5 = psVar22->hash_slot;
          iVar6 = psVar22->handle_index;
          pcVar2 = psVar22->data;
          iVar4 = psVar22->length;
          uVar3 = *(undefined8 *)&psVar22->refcount;
          psVar11 = psVar10 + iVar19;
          psVar11->size = psVar22->size;
          psVar11->length = iVar4;
          *(undefined8 *)(&psVar11->size + 2) = uVar3;
          psVar11 = psVar10 + iVar19;
          psVar11->hash_slot = iVar5;
          psVar11->handle_index = iVar6;
          psVar11->data = pcVar2;
          uVar13 = pool->hash_table[psVar22->hash_slot].hash_key;
          uVar14 = uVar13 & iVar7 - 1U;
          lVar16 = (long)(int)uVar14;
          uVar1 = __s[lVar16].hash_key;
          lVar17 = lVar16;
          while (uVar1 != 0) {
            uVar14 = uVar14 + 1 & iVar7 - 1U;
            lVar17 = (long)(int)uVar14;
            uVar1 = __s[lVar17].hash_key;
          }
          if (uVar13 == 0) {
            __assert_fail("hash",
                          "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                          ,0x2b6,"void strpool_defrag(strpool_t *)");
          }
          __s[lVar17].hash_key = uVar13;
          __s[lVar17].entry_index = iVar19;
          __s[lVar16].base_count = __s[lVar16].base_count + 1;
          psVar11 = psVar10 + iVar19;
          psVar11->hash_slot = uVar14;
          psVar11->data = __dest;
          psVar11->handle_index = psVar22->handle_index;
          pool->handles[psVar22->handle_index].entry_index = iVar19;
          memcpy(__dest,psVar22->data,(long)psVar22->length + 9);
          __dest = __dest + psVar22->size;
          iVar19 = iVar19 + 1;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < pool->entry_count);
    }
    (**pool->memctx)(pool->hash_table,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    (**pool->memctx)(pool->entries,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    if (0 < pool->block_count) {
      lVar17 = 8;
      lVar15 = 0;
      do {
        (**pool->memctx)(*(undefined8 *)((long)&pool->blocks->capacity + lVar17),0,0,0,0,0,
                         *(undefined8 *)((long)pool->memctx + 8));
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0x20;
      } while (lVar15 < pool->block_count);
    }
    if (pool->block_capacity != pool->initial_block_capacity) {
      (**pool->memctx)(pool->blocks,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
      psVar12 = (strpool_internal_block_t *)
                (**pool->memctx)(0,(long)pool->initial_block_capacity << 5,0,0,0,0,
                                 *(undefined8 *)((long)pool->memctx + 8));
      pool->blocks = psVar12;
      if (psVar12 == (strpool_internal_block_t *)0x0) {
        __assert_fail("pool->blocks",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x2cf,"void strpool_defrag(strpool_t *)");
      }
    }
    pool->block_capacity = pool->initial_block_capacity;
    pool->block_count = 1;
    pool->current_block = 0;
    psVar12 = pool->blocks;
    psVar12->capacity = iVar21;
    psVar12->data = pcVar9;
    psVar12->tail = __dest;
    psVar12->free_list = -1;
    pool->hash_table = __s;
    pool->hash_capacity = iVar7;
    pool->entries = psVar10;
    pool->entry_capacity = iVar8;
    pool->entry_count = iVar18;
    return;
  }
  __assert_fail("entries",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                ,0x2a7,"void strpool_defrag(strpool_t *)");
}

Assistant:

void strpool_defrag( strpool_t* pool )
    {
    int data_size = 0;
    int count = 0;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        strpool_internal_entry_t* entry = &pool->entries[ i ];
        if( entry->refcount > 0 )
            {
            data_size += entry->size;
            ++count;
            }
        }

    int data_capacity = data_size < pool->block_size ? 
        pool->block_size : (int)strpool_internal_pow2ceil( (STRPOOL_U32)data_size );

    int hash_capacity = count + count / 2;
    hash_capacity = hash_capacity < ( pool->initial_entry_capacity * 2 ) ? 
        ( pool->initial_entry_capacity * 2 ) : (int)strpool_internal_pow2ceil( (STRPOOL_U32)hash_capacity );
    strpool_internal_hash_slot_t* hash_table = (strpool_internal_hash_slot_t*) STRPOOL_MALLOC( pool->memctx, 
        hash_capacity * sizeof( *hash_table ) );
    STRPOOL_ASSERT( hash_table );
    STRPOOL_MEMSET( hash_table, 0, hash_capacity * sizeof( *hash_table ) );

    char* data = (char*) STRPOOL_MALLOC( pool->memctx, (size_t) data_capacity );
    STRPOOL_ASSERT( data );
    int capacity = count < pool->initial_entry_capacity ? 
        pool->initial_entry_capacity : (int)strpool_internal_pow2ceil( (STRPOOL_U32)count );
    strpool_internal_entry_t* entries = (strpool_internal_entry_t*) STRPOOL_MALLOC( pool->memctx, 
        capacity * sizeof( *entries ) );
    STRPOOL_ASSERT( entries );
    int index = 0;
    char* tail = data;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        strpool_internal_entry_t* entry = &pool->entries[ i ];
        if( entry->refcount > 0 )
            {
            entries[ index ] = *entry;

            STRPOOL_U32 hash = pool->hash_table[ entry->hash_slot ].hash_key;
            int base_slot = (int)( hash & (STRPOOL_U32)( hash_capacity - 1 ) );
            int slot = base_slot;
            while( hash_table[ slot ].hash_key )
                slot = (slot + 1 ) & ( hash_capacity - 1 );
            STRPOOL_ASSERT( hash );
            hash_table[ slot ].hash_key = hash;
            hash_table[ slot ].entry_index = index;
            ++hash_table[ base_slot ].base_count;

            entries[ index ].hash_slot = slot;
            entries[ index ].data = tail;
            entries[ index ].handle_index = entry->handle_index;
            pool->handles[ entry->handle_index ].entry_index = index;
            STRPOOL_MEMCPY( tail, entry->data, entry->length + 1 + 2 * sizeof( STRPOOL_U32 ) );
            tail += entry->size;
            ++index;
            }
        }


    STRPOOL_FREE( pool->memctx, pool->hash_table );
    STRPOOL_FREE( pool->memctx, pool->entries );
    for( int i = 0; i < pool->block_count; ++i ) STRPOOL_FREE( pool->memctx, pool->blocks[ i ].data );

    if( pool->block_capacity != pool->initial_block_capacity )
        {
        STRPOOL_FREE( pool->memctx, pool->blocks );
        pool->blocks = (strpool_internal_block_t*) STRPOOL_MALLOC( pool->memctx, 
            pool->initial_block_capacity * sizeof( *pool->blocks ) );
        STRPOOL_ASSERT( pool->blocks );
        }
    pool->block_capacity = pool->initial_block_capacity;
    pool->block_count = 1;
    pool->current_block = 0;
    pool->blocks[ 0 ].capacity = data_capacity;
    pool->blocks[ 0 ].data = data;
    pool->blocks[ 0 ].tail = tail;
    pool->blocks[ 0 ].free_list = -1;
    
    pool->hash_table = hash_table;
    pool->hash_capacity = hash_capacity;

    pool->entries = entries;
    pool->entry_capacity = capacity;
    pool->entry_count = count;
    }